

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderAtomicCountersTests.cpp
# Opt level: O3

long __thiscall glcts::BasicGLSLBuiltIn::Run(BasicGLSLBuiltIn *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint program;
  GLint GVar2;
  int *piVar3;
  long lVar4;
  int m_abuf;
  int m_cac;
  int m_csac;
  int m_fac;
  int m_vac;
  GLint local_48;
  GLint local_44;
  GLint local_40;
  GLint local_3c;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout(std430) buffer Output {\n  mediump uint data;\n} g_out;\nuniform mediump int m_vac;\nuniform mediump int m_fac;\nuniform mediump int m_csac;\nuniform mediump int m_cac;\nuniform mediump int m_abuf;\nvoid main() {\n  mediump uint res = 1u;\n  if (gl_MaxVertexAtomicCounters < 0 || gl_MaxVertexAtomicCounters != m_vac)\n     res = res * 2u;\n  if (gl_MaxFragmentAtomicCounters < 0 || gl_MaxFragmentAtomicCounters != m_fac)\n     res = res * 3u;\n  if (gl_MaxComputeAtomicCounters < 8 || gl_MaxComputeAtomicCounters != m_csac)\n     res = res * 5u;\n  if (gl_MaxCombinedAtomicCounters < 8 || gl_MaxCombinedAtomicCounters != m_cac)\n     res = res * 7u;\n  if (gl_MaxAtomicCounterBindings < 1 || gl_MaxAtomicCounterBindings != m_abuf)\n     res = res * 11u;\n  g_out.data = res;\n}"
             ,"");
  program = BasicUsageCS::CreateComputeProgram(&this->super_BasicUsageCS,&local_38);
  *(GLuint *)&(this->super_BasicUsageCS).field_0x34 = program;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    program = *(GLuint *)&(this->super_BasicUsageCS).field_0x34;
  }
  this_00 = &(this->super_BasicUsageCS).super_SACSubcaseBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar1 = BasicUsageCS::CheckProgram
                    (&this->super_BasicUsageCS,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,
                     (bool *)0x0);
  lVar4 = -1;
  if (bVar1) {
    glu::CallLogWrapper::glUseProgram(this_00,*(GLuint *)&(this->super_BasicUsageCS).field_0x34);
    glu::CallLogWrapper::glGetIntegerv(this_00,0x92d2,(GLint *)&local_38);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_vac");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,(GLint)local_38._M_dataplus._M_p);
    glu::CallLogWrapper::glGetIntegerv(this_00,0x92d6,&local_3c);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_fac");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,local_3c);
    glu::CallLogWrapper::glGetIntegerv(this_00,0x8265,&local_40);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_csac");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,local_40);
    glu::CallLogWrapper::glGetIntegerv(this_00,0x92d7,&local_44);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_cac");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,local_44);
    glu::CallLogWrapper::glGetIntegerv(this_00,0x92dc,&local_48);
    GVar2 = glu::CallLogWrapper::glGetUniformLocation
                      (this_00,*(GLuint *)&(this->super_BasicUsageCS).field_0x34,"m_abuf");
    glu::CallLogWrapper::glUniform1i(this_00,GVar2,local_48);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&this->m_buffer);
    lVar4 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,4,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_buffer);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    piVar3 = (int *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,4,1);
    if (*piVar3 != 1) {
      glcts::anon_unknown_0::Output("Expected 1, got: %d");
      lVar4 = -1;
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,0);
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{
		// create program
		const char* const glsl_cs = NL
			"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;" NL "layout(std430) buffer Output {" NL
			"  mediump uint data;" NL "} g_out;" NL "uniform mediump int m_vac;" NL "uniform mediump int m_fac;" NL
			"uniform mediump int m_csac;" NL "uniform mediump int m_cac;" NL "uniform mediump int m_abuf;" NL
			"void main() {" NL "  mediump uint res = 1u;" NL
			"  if (gl_MaxVertexAtomicCounters < 0 || gl_MaxVertexAtomicCounters != m_vac)" NL "     res = res * 2u;" NL
			"  if (gl_MaxFragmentAtomicCounters < 0 || gl_MaxFragmentAtomicCounters != m_fac)" NL
			"     res = res * 3u;" NL
			"  if (gl_MaxComputeAtomicCounters < 8 || gl_MaxComputeAtomicCounters != m_csac)" NL
			"     res = res * 5u;" NL
			"  if (gl_MaxCombinedAtomicCounters < 8 || gl_MaxCombinedAtomicCounters != m_cac)" NL
			"     res = res * 7u;" NL
			"  if (gl_MaxAtomicCounterBindings < 1 || gl_MaxAtomicCounterBindings != m_abuf)" NL
			"     res = res * 11u;" NL "  g_out.data = res;" NL "}";

		prog_ = CreateComputeProgram(glsl_cs);
		glLinkProgram(prog_);
		if (!CheckProgram(prog_))
			return ERROR;
		glUseProgram(prog_);

		int m_vac;
		int m_fac;
		int m_csac;
		int m_cac;
		int m_abuf;
		glGetIntegerv(GL_MAX_VERTEX_ATOMIC_COUNTERS, &m_vac);
		glUniform1i(glGetUniformLocation(prog_, "m_vac"), m_vac);
		glGetIntegerv(GL_MAX_FRAGMENT_ATOMIC_COUNTERS, &m_fac);
		glUniform1i(glGetUniformLocation(prog_, "m_fac"), m_fac);
		glGetIntegerv(GL_MAX_COMPUTE_ATOMIC_COUNTERS, &m_csac);
		glUniform1i(glGetUniformLocation(prog_, "m_csac"), m_csac);
		glGetIntegerv(GL_MAX_COMBINED_ATOMIC_COUNTERS, &m_cac);
		glUniform1i(glGetUniformLocation(prog_, "m_cac"), m_cac);
		glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &m_abuf);
		glUniform1i(glGetUniformLocation(prog_, "m_abuf"), m_abuf);

		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint), NULL, GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glDispatchCompute(1, 1, 1);

		long	error = NO_ERROR;
		GLuint* data;
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		data = static_cast<GLuint*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint), GL_MAP_READ_BIT));
		if (data[0] != 1u)
		{
			Output("Expected 1, got: %d", data[0]);
			error = ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		return error;
	}